

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode http_rw_hd(Curl_easy *data,char *hd,size_t hdlen,char *buf_remain,size_t blen,
                   size_t *pconsumed)

{
  ConnectBits *pCVar1;
  undefined1 *puVar2;
  int *piVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  curlntlm cVar7;
  connectdata *conn;
  curl_trc_feat *pcVar8;
  bool bVar9;
  _Bool _Var10;
  CURLcode CVar11;
  CURLcode CVar12;
  int iVar13;
  statusline sVar14;
  char *pcVar15;
  size_t hdlen_00;
  Curl_creader *pCVar16;
  char *pcVar17;
  void *pvVar18;
  CURLcode unaff_EBP;
  int iVar19;
  bool bVar20;
  dynbuf last_header;
  dynbuf local_50;
  
  buf_remain[0] = '\0';
  buf_remain[1] = '\0';
  buf_remain[2] = '\0';
  buf_remain[3] = '\0';
  buf_remain[4] = '\0';
  buf_remain[5] = '\0';
  buf_remain[6] = '\0';
  buf_remain[7] = '\0';
  if ((*hd == '\r') || (*hd == '\n')) {
    Curl_dyn_init(&local_50,hdlen + 1);
    CVar11 = Curl_dyn_addn(&local_50,hd,hdlen);
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
    Curl_dyn_reset(&(data->state).headerb);
    pcVar15 = Curl_dyn_ptr(&local_50);
    hdlen_00 = Curl_dyn_len(&local_50);
    conn = data->conn;
    if (((((data->req).upgr101 == UPGR101_RECEIVED) && (data != (Curl_easy *)0x0)) &&
        (conn->httpversion != '\x14')) &&
       ((((data->set).field_0x8cd & 0x10) != 0 &&
        ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)))))
       ) {
      Curl_infof(data,"Lying server, not serving HTTP/2");
    }
    if ((pcVar15 != (char *)0x0) && ((data->req).httpcode < 200)) {
      CVar11 = http_write_header(data,pcVar15,hdlen_00);
      pcVar15 = (char *)0x0;
      if (CVar11 != CURLE_OK) goto LAB_0013709c;
    }
    iVar13 = (data->req).httpcode;
    if (iVar13 < 100) {
      Curl_failf(data,"Unsupported response code in HTTP response");
    }
    else {
      uVar6 = *(uint *)&(data->req).field_0xd9;
      if (199 < iVar13) {
        *(uint *)&(data->req).field_0xd9 = uVar6 & 0xfffffffe;
        if ((data->req).upgr101 == UPGR101_H2) {
          pCVar1 = &data->conn->bits;
          *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
          Curl_multi_connchanged(data->multi);
        }
        if ((((((data->req).size == -1) && (((data->req).field_0xda & 0x10) == 0)) &&
             (((ulong)conn->bits & 0x20) == 0)) &&
            ((conn->httpversion == '\v' && ((conn->handler->protocol & 0x40000) == 0)))) &&
           ((data->state).httpreq != '\x05')) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
              (0 < pcVar8->log_level)))) {
            Curl_infof(data,"no chunk, no close, no size. Assume close to signal end");
          }
          Curl_conncontrol(conn,2);
        }
        if (((ulong)conn->bits & 0x20) != 0) {
          iVar13 = (data->req).httpcode;
          if (iVar13 == 0x197) {
            cVar7 = conn->proxy_ntlm_state;
          }
          else {
            if (iVar13 != 0x191) goto LAB_00137296;
            cVar7 = conn->http_ntlm_state;
          }
          if (cVar7 == NTLMSTATE_TYPE2) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                (0 < pcVar8->log_level)))) {
              Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)");
            }
            puVar2 = &(data->state).field_0x744;
            *puVar2 = *puVar2 | 0x20;
          }
        }
LAB_00137296:
        uVar6 = (data->req).httpcode;
        _Var10 = http_should_fail(data,uVar6);
        if (_Var10) {
          Curl_failf(data,"The requested URL returned error: %d",(ulong)uVar6);
          CVar11 = CURLE_HTTP_RETURNED_ERROR;
        }
        else {
          CVar11 = Curl_http_auth_act(data);
          if (CVar11 == CURLE_OK) {
            if (299 < (data->req).httpcode) {
              if ((((((data->req).field_0xdb & 4) == 0) && (((ulong)conn->bits & 0x20) == 0)) &&
                  (_Var10 = Curl_creader_will_rewind(data), !_Var10)) &&
                 (((byte)((data->state).httpreq - 1) < 4 &&
                  (_Var10 = Curl_req_done_sending(data), !_Var10)))) {
                if (((data->req).httpcode == 0x1a1) &&
                   (pCVar16 = Curl_creader_get_by_type(data,&cr_exp100),
                   pCVar16 != (Curl_creader *)0x0)) {
                  if ((((data->req).writebytecount == 0) &&
                      (pCVar16 = Curl_creader_get_by_type(data,&cr_exp100),
                      pCVar16 != (Curl_creader *)0x0)) && (*(int *)((long)pCVar16->ctx + 0x30) == 1)
                     ) {
                    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                       ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar8->log_level)))) {
                      Curl_infof(data,"Got HTTP failure 417 while waiting for a 100");
                    }
                  }
                  else {
                    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                       ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar8->log_level)))) {
                      Curl_infof(data,"Got HTTP failure 417 while sending data");
                    }
                    Curl_conncontrol(conn,2);
                    http_perhapsrewind(data,conn);
                  }
                  puVar2 = &(data->state).field_0x744;
                  *puVar2 = *puVar2 | 0x80;
                  pcVar17 = (*Curl_cstrdup)((data->state).url);
                  (data->req).newurl = pcVar17;
                  Curl_req_abort_sending(data);
                }
                else {
                  uVar6 = *(uint *)&(data->set).field_0x8ca;
                  bVar20 = (uVar6 >> 0x1c & 1) != 0;
                  if ((uVar6 >> 0x14 & 1) == 0) {
                    if ((bVar20 && data != (Curl_easy *)0x0) &&
                       ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar8->log_level)))) {
                      Curl_infof(data,"HTTP error before end of send, stop sending");
                    }
                    Curl_conncontrol(conn,2);
                    CVar11 = Curl_req_abort_sending(data);
                    if (CVar11 != CURLE_OK) goto LAB_0013709c;
                  }
                  else {
                    if ((bVar20 && data != (Curl_easy *)0x0) &&
                       ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar8->log_level)))) {
                      Curl_infof(data,"HTTP error before end of send, keep sending");
                    }
                    http_exp100_send_anyway(data);
                  }
                }
              }
              _Var10 = Curl_creader_will_rewind(data);
              if ((_Var10) && (_Var10 = Curl_req_done_sending(data), !_Var10)) {
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar8->log_level)))) {
                  Curl_infof(data,"Keep sending data to get tossed away");
                }
                piVar3 = &(data->req).keepon;
                *(byte *)piVar3 = (byte)*piVar3 | 2;
              }
            }
            uVar6 = *(uint *)&(data->req).field_0xd9;
            if ((uVar6 >> 0x11 & 1) != 0) {
              *(uint *)&(data->req).field_0xd9 = uVar6 | 8;
            }
            if ((data->req).maxdownload == 0) {
              puVar2 = &(data->req).field_0xd9;
              *puVar2 = *puVar2 | 8;
            }
            CVar11 = Curl_http_firstwrite(data);
            if (CVar11 == CURLE_OK) {
              CVar11 = Curl_http_size(data);
            }
          }
        }
        goto LAB_0013709c;
      }
      *(uint *)&(data->req).field_0xd9 = uVar6 | 1;
      (data->req).headerline = 0;
      CVar11 = CURLE_OK;
      if (iVar13 != 0x65) {
        if (iVar13 == 100) {
          Curl_http_exp100_got100(data);
        }
        goto LAB_0013709c;
      }
      if (conn->httpversion != '\v') {
        Curl_failf(data,"unexpected 101 response code");
        CVar11 = CURLE_WEIRD_SERVER_REPLY;
        goto LAB_0013709c;
      }
      if ((data->req).upgr101 != UPGR101_H2) {
        *(uint *)&(data->req).field_0xd9 = uVar6 & 0xfffffffe;
        goto LAB_0013709c;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        Curl_infof(data,"Received 101, Switching to HTTP/2");
      }
      (data->req).upgr101 = UPGR101_RECEIVED;
      pCVar1 = &data->conn->bits;
      *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
      puVar2 = &(data->req).field_0xd9;
      *puVar2 = *puVar2 | 1;
      (data->req).headerline = 0;
    }
    CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
LAB_0013709c:
    if ((pcVar15 != (char *)0x0) &&
       (CVar12 = http_write_header(data,pcVar15,hdlen_00), CVar11 == CURLE_OK)) {
      CVar11 = CVar12;
    }
    Curl_dyn_free(&local_50);
    return CVar11;
  }
  iVar13 = (data->req).headerline;
  (data->req).headerline = iVar13 + 1;
  iVar19 = 4;
  if (iVar13 == 0) {
    (data->req).httpversion = 0;
    uVar6 = data->conn->handler->protocol;
    pcVar15 = hd;
    if ((uVar6 & 3) == 0) {
      if ((uVar6 >> 0x12 & 1) == 0) {
        bVar20 = false;
      }
      else {
        for (; (*pcVar15 == ' ' || (*pcVar15 == '\t')); pcVar15 = pcVar15 + 1) {
        }
        iVar13 = strncmp(pcVar15,"RTSP/",5);
        if (iVar13 == 0) {
          if ((((((byte)(pcVar15[5] - 0x30U) < 10) && (pcVar15[6] == '.')) &&
               ((byte)(pcVar15[7] - 0x30U) < 10)) && ((pcVar15[8] == ' ' || (pcVar15[8] == '\t'))))
             && (((byte)(pcVar15[9] - 0x30U) < 10 &&
                 (((byte)(pcVar15[10] - 0x30U) < 10 && ((byte)(pcVar15[0xb] - 0x30U) < 10)))))) {
            (data->req).httpcode =
                 (uint)(byte)(pcVar15[0xb] - 0x30U) +
                 (uint)(byte)(pcVar15[10] * '\n' + 0x20) + (uint)(byte)(pcVar15[9] - 0x30U) * 100;
            cVar5 = pcVar15[0xc];
            if ((cVar5 == '\t') || ((cVar5 == ' ' || ((byte)(cVar5 - 10U) < 4)))) {
              (data->req).httpversion = 0xb;
              bVar9 = true;
              bVar20 = bVar9;
              goto LAB_001376a6;
            }
          }
          bVar9 = false;
          bVar20 = bVar9;
        }
        else {
          bVar9 = true;
          bVar20 = false;
        }
LAB_001376a6:
        CVar11 = CURLE_WEIRD_SERVER_REPLY;
        unaff_EBP = CURLE_WEIRD_SERVER_REPLY;
        if (!bVar9) goto LAB_0013772a;
      }
LAB_001376f4:
      CVar11 = unaff_EBP;
      if (!bVar20) {
        puVar2 = &(data->req).field_0xd9;
        *puVar2 = *puVar2 & 0xfe;
        CVar11 = CURLE_WEIRD_SERVER_REPLY;
        goto LAB_0013772a;
      }
      CVar12 = Curl_http_statusline(data,data->conn);
      bVar20 = CVar12 == CURLE_OK;
      iVar19 = (uint)bVar20 * 8 + 4;
      if (!bVar20) {
        CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
      }
    }
    else {
      for (; (*pcVar15 == ' ' || (*pcVar15 == '\t')); pcVar15 = pcVar15 + 1) {
      }
      iVar13 = strncmp(pcVar15,"HTTP/",5);
      if (iVar13 != 0) goto LAB_00137120;
      bVar4 = pcVar15[5];
      if (bVar4 - 0x32 < 2) {
        if ((pcVar15[6] == ' ') || (pcVar15[6] == '\t')) {
          (data->req).httpversion = (char)bVar4 * 10 + -0x1e0;
          if (((byte)(pcVar15[7] - 0x30U) < 10) &&
             (((byte)(pcVar15[8] - 0x30U) < 10 && ((byte)(pcVar15[9] - 0x30U) < 10)))) {
            (data->req).httpcode =
                 (uint)(byte)(pcVar15[9] - 0x30U) +
                 (uint)(byte)(pcVar15[8] * '\n' + 0x20) + (uint)(byte)(pcVar15[7] - 0x30U) * 100;
            cVar5 = pcVar15[10];
            if ((cVar5 == '\t') || ((cVar5 == ' ' || ((byte)(cVar5 - 10U) < 4)))) {
              bVar20 = true;
              goto LAB_00137123;
            }
          }
        }
LAB_00137120:
        bVar20 = false;
LAB_00137123:
        bVar9 = true;
        if ((!bVar20) && (sVar14 = checkhttpprefix(data,hd,hdlen), sVar14 == STATUS_DONE)) {
          (data->req).httpversion = 10;
          (data->req).httpcode = 200;
          bVar9 = true;
          bVar20 = true;
        }
      }
      else if (bVar4 == 0x31) {
        if (((pcVar15[6] == '.') && ((pcVar15[7] & 0xfeU) == 0x30)) &&
           ((pcVar15[8] == ' ' || (pcVar15[8] == '\t')))) {
          (data->req).httpversion = (byte)pcVar15[7] - 0x26;
          if (((9 < (byte)(pcVar15[9] - 0x30U)) || (9 < (byte)(pcVar15[10] - 0x30U))) ||
             (9 < (byte)(pcVar15[0xb] - 0x30U))) goto LAB_001376ca;
          (data->req).httpcode =
               (uint)(byte)(pcVar15[0xb] - 0x30U) +
               (uint)(byte)(pcVar15[10] * '\n' + 0x20) + (uint)(byte)(pcVar15[9] - 0x30U) * 100;
          cVar5 = pcVar15[0xc];
          if (((cVar5 != '\t') && (cVar5 != ' ')) && (3 < (byte)(cVar5 - 10U))) goto LAB_001376ca;
          bVar20 = true;
        }
        else {
LAB_001376ca:
          bVar20 = false;
        }
        if (bVar20) goto LAB_00137123;
        bVar9 = false;
        Curl_failf(data,"Unsupported HTTP/1 subversion in response");
      }
      else {
        bVar9 = false;
        Curl_failf(data,"Unsupported HTTP version in response");
        bVar20 = false;
      }
      CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
      unaff_EBP = CURLE_UNSUPPORTED_PROTOCOL;
      if (bVar9) goto LAB_001376f4;
LAB_0013772a:
      iVar19 = 4;
      bVar20 = false;
    }
    if (!bVar20) {
      return CVar11;
    }
  }
  CVar11 = CURLE_OK;
  pvVar18 = memchr(hd,0,hdlen);
  if (pvVar18 == (void *)0x0) {
    iVar13 = (data->req).headerline;
    bVar20 = true;
    if (((iVar13 < 2) || (((*hd == ' ' || (*hd == '\t')) && (iVar13 != 2)))) ||
       (pvVar18 = memchr(hd,0x3a,hdlen), pvVar18 != (void *)0x0)) goto LAB_0013779f;
    pcVar15 = "Header without colon";
  }
  else {
    pcVar15 = "Nul byte in header";
  }
  bVar20 = false;
  Curl_failf(data,pcVar15);
  CVar11 = CURLE_WEIRD_SERVER_REPLY;
LAB_0013779f:
  if ((bVar20) && (CVar11 = Curl_http_header(data,hd,hdlen), CVar11 == CURLE_OK)) {
    Curl_debug(data,CURLINFO_HEADER_IN,hd,hdlen);
    iVar13 = iVar19 + 0x20;
    if (99 < (data->req).httpcode - 100U) {
      iVar13 = iVar19;
    }
    CVar11 = Curl_client_write(data,iVar13,hd,hdlen);
    if (CVar11 == CURLE_OK) {
      CVar11 = Curl_bump_headersize(data,hdlen,false);
      return CVar11;
    }
  }
  return CVar11;
}

Assistant:

static CURLcode http_rw_hd(struct Curl_easy *data,
                           const char *hd, size_t hdlen,
                           const char *buf_remain, size_t blen,
                           size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  int writetype;

  *pconsumed = 0;
  if((0x0a == *hd) || (0x0d == *hd)) {
    /* Empty header line means end of headers! */
    struct dynbuf last_header;
    size_t consumed;

    Curl_dyn_init(&last_header, hdlen + 1);
    result = Curl_dyn_addn(&last_header, hd, hdlen);
    if(result)
      return result;

    /* analyze the response to find out what to do. */
    /* Caveat: we clear anything in the header brigade, because a
     * response might switch HTTP version which may call use recursively.
     * Not nice, but that is currently the way of things. */
    Curl_dyn_reset(&data->state.headerb);
    result = http_on_response(data, Curl_dyn_ptr(&last_header),
                              Curl_dyn_len(&last_header),
                              buf_remain, blen, &consumed);
    *pconsumed += consumed;
    Curl_dyn_free(&last_header);
    return result;
  }

  /*
   * Checks for special headers coming up.
   */

  writetype = CLIENTWRITE_HEADER;
  if(!k->headerline++) {
    /* This is the first header, it MUST be the error code line
       or else we consider this to be the body right away! */
    bool fine_statusline = FALSE;

    k->httpversion = 0; /* Do not know yet */
    if(data->conn->handler->protocol & PROTO_FAMILY_HTTP) {
      /*
       * https://datatracker.ietf.org/doc/html/rfc7230#section-3.1.2
       *
       * The response code is always a three-digit number in HTTP as the spec
       * says. We allow any three-digit number here, but we cannot make
       * guarantees on future behaviors since it is not within the protocol.
       */
      const char *p = hd;

      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "HTTP/", 5)) {
        p += 5;
        switch(*p) {
        case '1':
          p++;
          if((p[0] == '.') && (p[1] == '0' || p[1] == '1')) {
            if(ISBLANK(p[2])) {
              k->httpversion = 10 + (p[1] - '0');
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p))
                  fine_statusline = TRUE;
              }
            }
          }
          if(!fine_statusline) {
            failf(data, "Unsupported HTTP/1 subversion in response");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        case '2':
        case '3':
          if(!ISBLANK(p[1]))
            break;
          k->httpversion = (*p - '0') * 10;
          p += 2;
          if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
            k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
              (p[2] - '0');
            p += 3;
            if(!ISSPACE(*p))
              break;
            fine_statusline = TRUE;
          }
          break;
        default: /* unsupported */
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }

      if(!fine_statusline) {
        /* If user has set option HTTP200ALIASES,
           compare header line against list of aliases
        */
        statusline check = checkhttpprefix(data, hd, hdlen);
        if(check == STATUS_DONE) {
          fine_statusline = TRUE;
          k->httpcode = 200;
          k->httpversion = 10;
        }
      }
    }
    else if(data->conn->handler->protocol & CURLPROTO_RTSP) {
      const char *p = hd;
      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "RTSP/", 5)) {
        p += 5;
        if(ISDIGIT(*p)) {
          p++;
          if((p[0] == '.') && ISDIGIT(p[1])) {
            if(ISBLANK(p[2])) {
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p)) {
                  fine_statusline = TRUE;
                  k->httpversion = 11; /* RTSP acts like HTTP 1.1 */
                }
              }
            }
          }
        }
        if(!fine_statusline)
          return CURLE_WEIRD_SERVER_REPLY;
      }
    }

    if(fine_statusline) {
      result = Curl_http_statusline(data, data->conn);
      if(result)
        return result;
      writetype |= CLIENTWRITE_STATUS;
    }
    else {
      k->header = FALSE;   /* this is not a header line */
      return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  result = verify_header(data, hd, hdlen);
  if(result)
    return result;

  result = Curl_http_header(data, hd, hdlen);
  if(result)
    return result;

  /*
   * Taken in one (more) header. Write it to the client.
   */
  Curl_debug(data, CURLINFO_HEADER_IN, (char *)hd, hdlen);

  if(k->httpcode/100 == 1)
    writetype |= CLIENTWRITE_1XX;
  result = Curl_client_write(data, writetype, hd, hdlen);
  if(result)
    return result;

  result = Curl_bump_headersize(data, hdlen, FALSE);
  if(result)
    return result;

  return CURLE_OK;
}